

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::RemoveEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar1;
  IRKind IVar2;
  BasicBlock *block;
  BasicBlock *this_00;
  Instr *this_01;
  BasicBlock *pBVar3;
  code *pcVar4;
  bool bVar5;
  BasicBlock *block_00;
  undefined4 *puVar6;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Type *ppFVar8;
  LabelInstr *branchTarget;
  BranchInstr *newInstr;
  long lVar9;
  Func **ppFVar10;
  BasicBlock *this_02;
  Iterator local_40;
  
  block_00 = Loop::GetHeadBlock(loop);
  block = block_00->next;
  pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
           (block_00->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  this_00 = loop->landingPad;
  pSVar1 = &block_00->succList;
  if ((pSVar7 == &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)
      ((pSVar7->super_SListNodeBase<Memory::ArenaAllocator>).next)->next != pSVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x241d,"(succList->HasTwo())","succList->HasTwo()");
    if (!bVar5) goto LAB_003d64a6;
    *puVar6 = 0;
    pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
  }
  local_40.current =
       &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
        super_SListNodeBase<Memory::ArenaAllocator>;
  if (pSVar7 != &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>) {
    local_40.current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
  }
  local_40.list = &pSVar1->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
  if ((*ppFVar8)->succBlock == block) {
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_003d64a6;
      *puVar6 = 0;
    }
    pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    local_40.current =
         &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
          super_SListNodeBase<Memory::ArenaAllocator>;
    if (pSVar7 != local_40.list) {
      local_40.current = (NodeBase *)pSVar7;
    }
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    this_02 = (*ppFVar8)->succBlock;
  }
  else {
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    this_02 = (*ppFVar8)->succBlock;
    if ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_003d64a6;
      *puVar6 = 0;
    }
    pSVar7 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
    local_40.current =
         &((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0)->
          super_SListNodeBase<Memory::ArenaAllocator>;
    if (pSVar7 != local_40.list) {
      local_40.current = (NodeBase *)pSVar7;
    }
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    if ((*ppFVar8)->succBlock != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x242c,"(iter.Data()->GetSucc() == tail)","iter.Data()->GetSucc() == tail"
                        );
      if (!bVar5) goto LAB_003d64a6;
      *puVar6 = 0;
    }
  }
  BasicBlock::RemovePred(this_02,block_00,this->func->m_fg);
  BasicBlock::RemoveSucc(this_00,block_00,this->func->m_fg);
  if ((this_00->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2432,"(landingPad->GetSuccList()->Count() == 0)",
                       "landingPad->GetSuccList()->Count() == 0");
    if (!bVar5) goto LAB_003d64a6;
    *puVar6 = 0;
  }
  this_01 = this_02->firstInstr;
  IVar2 = this_01->m_kind;
  if ((IVar2 == InstrKindProfiledLabel) || (IVar2 == InstrKindLabel)) {
    pBVar3 = this_00->next;
    ppFVar10 = (Func **)&pBVar3->firstInstr;
    if (pBVar3 == (BasicBlock *)0x0) {
      ppFVar10 = &this_00->func;
    }
    lVar9 = 0x18;
    if (pBVar3 == (BasicBlock *)0x0) {
      lVar9 = 0xd0;
    }
    bVar5 = IR::Instr::EndsBasicBlock(*(Instr **)((long)&(*ppFVar10)->m_alloc + lVar9));
    if (!bVar5) goto LAB_003d642c;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                     ,0x2435,
                     "(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock())"
                     ,
                     "firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock()"
                    );
  if (!bVar5) {
LAB_003d64a6:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar6 = 0;
LAB_003d642c:
  branchTarget = IR::Instr::AsLabelInstr(this_01);
  newInstr = IR::BranchInstr::New(Br,branchTarget,this->func);
  BasicBlock::InsertAfter(this_00,&newInstr->super_Instr);
  FlowGraph::AddEdge(this->func->m_fg,this_00,this_02);
  FlowGraph::RemoveBlock(this->func->m_fg,block_00,(GlobOpt *)0x0,false);
  if (block_00 != block) {
    FlowGraph::RemoveBlock(this->func->m_fg,block,(GlobOpt *)0x0,false);
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoopAfterMemOp(Loop *loop)
{
    BasicBlock *head = loop->GetHeadBlock();
    BasicBlock *tail = head->next;
    BasicBlock *landingPad = loop->landingPad;
    BasicBlock *outerBlock = nullptr;
    SListBaseCounted<FlowEdge *> *succList = head->GetSuccList();
    Assert(succList->HasTwo());

    // Between the two successors of head, one is tail and the other one is the outerBlock
    SListBaseCounted<FlowEdge *>::Iterator  iter(succList);
    iter.Next();
    if (iter.Data()->GetSucc() == tail)
    {
        iter.Next();
        outerBlock = iter.Data()->GetSucc();
    }
    else
    {
        outerBlock = iter.Data()->GetSucc();
#ifdef DBG
        iter.Next();
        Assert(iter.Data()->GetSucc() == tail);
#endif
    }

    outerBlock->RemovePred(head, this->func->m_fg);
    landingPad->RemoveSucc(head, this->func->m_fg);
    Assert(landingPad->GetSuccList()->Count() == 0);

    IR::Instr* firstOuterInstr = outerBlock->GetFirstInstr();
    AssertOrFailFast(firstOuterInstr->IsLabelInstr() && !landingPad->GetLastInstr()->EndsBasicBlock());
    IR::LabelInstr* label = firstOuterInstr->AsLabelInstr();
    // Add br to Outer block to keep coherence between branches and flow graph
    IR::BranchInstr *outerBr = IR::BranchInstr::New(Js::OpCode::Br, label, this->func);
    landingPad->InsertAfter(outerBr);
    this->func->m_fg->AddEdge(landingPad, outerBlock);

    this->func->m_fg->RemoveBlock(head, nullptr);

    if (head != tail)
    {
        this->func->m_fg->RemoveBlock(tail, nullptr);
    }
}